

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O0

bool double_conversion::isWhitespace(int x)

{
  int i_1;
  int i;
  int x_local;
  
  if (x < 0x80) {
    for (i = 0; i < 6; i = i + 1) {
      if (*(char *)((long)&kWhitespaceTable7 + (long)i) == x) {
        return true;
      }
    }
  }
  else {
    for (i_1 = 0; i_1 < 0x14; i_1 = i_1 + 1) {
      if ((uint)*(ushort *)(kWhitespaceTable16 + (long)i_1 * 2) == x) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool isWhitespace(int x) {
  if (x < 128) {
    for (int i = 0; i < kWhitespaceTable7Length; i++) {
      if (kWhitespaceTable7[i] == x) return true;
    }
  } else {
    for (int i = 0; i < kWhitespaceTable16Length; i++) {
      if (kWhitespaceTable16[i] == x) return true;
    }
  }
  return false;
}